

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseStorage.h
# Opt level: O2

void __thiscall
Eigen::DenseStorage<long,_-1,_-1,_1,_0>::resize
          (DenseStorage<long,__1,__1,_1,_0> *this,DenseIndex size,DenseIndex nbRows,
          DenseIndex param_3)

{
  long *plVar1;
  
  if (this->m_rows != size) {
    free(this->m_data);
    if (size == 0) {
      plVar1 = (long *)0x0;
    }
    else {
      plVar1 = internal::conditional_aligned_new_auto<long,true>(size);
    }
    this->m_data = plVar1;
  }
  this->m_rows = nbRows;
  return;
}

Assistant:

EIGEN_STRONG_INLINE void resize(DenseIndex size, DenseIndex nbRows, DenseIndex)
    {
      if(size != m_rows*_Cols)
      {
        internal::conditional_aligned_delete_auto<T,(_Options&DontAlign)==0>(m_data, _Cols*m_rows);
        if (size)
          m_data = internal::conditional_aligned_new_auto<T,(_Options&DontAlign)==0>(size);
        else
          m_data = 0;
        EIGEN_INTERNAL_DENSE_STORAGE_CTOR_PLUGIN
      }
      m_rows = nbRows;
    }
    inline const T *data() const { return m_data; }
    inline T *data() { return m_data; }
}